

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> * __thiscall
chaiscript::dispatch::Param_Types::convert
          (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
           *__return_storage_ptr__,Param_Types *this,Function_Params t_params,
          Type_Conversions_State *t_conversions)

{
  undefined8 to;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Type_Info *pTVar4;
  const_reference pvVar5;
  Type_Conversions *pTVar6;
  Conversion_Saves *from;
  reference this_00;
  bad_any_cast *anon_var_0;
  undefined1 local_80 [24];
  Type_Info *ti;
  value_type *bv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  size_t i;
  Type_Info dynamic_object_type_info;
  Type_Conversions_State *t_conversions_local;
  Param_Types *this_local;
  Function_Params t_params_local;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *vals;
  
  t_params_local.m_begin = t_params.m_end;
  this_local = (Param_Types *)t_params.m_begin;
  dynamic_object_type_info._23_1_ = 0;
  t_params_local.m_end = (Boxed_Value *)__return_storage_ptr__;
  Function_Params::to_vector(__return_storage_ptr__,(Function_Params *)&this_local);
  user_type<chaiscript::dispatch::Dynamic_Object>();
  for (name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pbVar1 = name,
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::size
                         (__return_storage_ptr__), pbVar1 < pbVar3;
      name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(name->_M_dataplus)._M_p + 1)) {
    bv = (value_type *)
         std::
         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
         ::operator[](&this->m_types,(size_type)name);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bv);
    if (!bVar2) {
      ti = (Type_Info *)
           std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
           operator[](__return_storage_ptr__,(size_type)name);
      pTVar4 = Boxed_Value::get_type_info((Boxed_Value *)ti);
      bVar2 = Type_Info::bare_equal(pTVar4,(Type_Info *)&i);
      if (!bVar2) {
        pvVar5 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                 ::operator[](&this->m_types,(size_type)name);
        local_80._16_8_ = &pvVar5->second;
        bVar2 = Type_Info::is_undef((Type_Info *)local_80._16_8_);
        if (!bVar2) {
          pTVar4 = Boxed_Value::get_type_info((Boxed_Value *)ti);
          bVar2 = Type_Info::bare_equal(pTVar4,(Type_Info *)local_80._16_8_);
          if (!bVar2) {
            pTVar6 = Type_Conversions_State::operator->(t_conversions);
            to = local_80._16_8_;
            pTVar4 = Boxed_Value::get_type_info((Boxed_Value *)ti);
            bVar2 = Type_Conversions::converts(pTVar6,(Type_Info *)to,pTVar4);
            if (bVar2) {
              pTVar6 = Type_Conversions_State::operator->(t_conversions);
              pvVar5 = std::
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                       ::operator[](&this->m_types,(size_type)name);
              from = Type_Conversions_State::saves(t_conversions);
              std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
              operator[](__return_storage_ptr__,(size_type)name);
              Type_Conversions::boxed_type_conversion
                        ((Type_Conversions *)local_80,(Type_Info *)pTVar6,
                         (Conversion_Saves *)&pvVar5->second,(Boxed_Value *)from);
              this_00 = std::
                        vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
                        operator[](__return_storage_ptr__,(size_type)name);
              Boxed_Value::operator=(this_00,(Boxed_Value *)local_80);
              Boxed_Value::~Boxed_Value((Boxed_Value *)local_80);
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Boxed_Value> convert(Function_Params t_params, const Type_Conversions_State &t_conversions) const {
        auto vals = t_params.to_vector();
        const auto dynamic_object_type_info = user_type<Dynamic_Object>();
        for (size_t i = 0; i < vals.size(); ++i) {
          const auto &name = m_types[i].first;
          if (!name.empty()) {
            const auto &bv = vals[i];

            if (!bv.get_type_info().bare_equal(dynamic_object_type_info)) {
              const auto &ti = m_types[i].second;
              if (!ti.is_undef()) {
                if (!bv.get_type_info().bare_equal(ti)) {
                  if (t_conversions->converts(ti, bv.get_type_info())) {
                    try {
                      // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
                      // either way, we are not responsible if it doesn't work
                      vals[i] = t_conversions->boxed_type_conversion(m_types[i].second, t_conversions.saves(), vals[i]);
                    } catch (...) {
                      try {
                        // try going the other way
                        vals[i] = t_conversions->boxed_type_down_conversion(m_types[i].second, t_conversions.saves(), vals[i]);
                      } catch (const chaiscript::detail::exception::bad_any_cast &) {
                        throw exception::bad_boxed_cast(bv.get_type_info(), *m_types[i].second.bare_type_info());
                      }
                    }
                  }
                }
              }
            }
          }
        }

        return vals;
      }